

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::NumberFormat::format
          (NumberFormat *this,Formattable *obj,UnicodeString *appendTo,
          FieldPositionIterator *posIter,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  Type TVar4;
  undefined4 extraout_var;
  UnicodeString *pUVar6;
  ArgExtractor arg;
  ArgExtractor local_48;
  long *plVar5;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    ArgExtractor::ArgExtractor(&local_48,(NumberFormat *)obj,obj,(UErrorCode *)posIter);
    if (local_48.fWasCurrency != '\0') {
      iVar2 = u_strcmp_63(local_48.save,this->fCurrency);
      if (iVar2 != 0) {
        iVar3 = (*(this->super_Format).super_UObject._vptr_UObject[4])(this);
        plVar5 = (long *)CONCAT44(extraout_var,iVar3);
        (**(code **)(*plVar5 + 0xf8))(plVar5,local_48.save,status);
        pUVar6 = (UnicodeString *)
                 (**(code **)(*plVar5 + 0x30))(plVar5,local_48.num,appendTo,posIter,status);
        (**(code **)(*plVar5 + 8))(plVar5);
        return pUVar6;
      }
    }
    UVar1 = Formattable::isNumeric(local_48.num);
    if ((UVar1 == '\0') || ((local_48.num)->fDecimalQuantity == (DecimalQuantity *)0x0)) {
      TVar4 = Formattable::getType(local_48.num);
      if (TVar4 == kInt64) {
        (*(this->super_Format).super_UObject._vptr_UObject[0x10])
                  (this,((local_48.num)->fValue).fObject,appendTo,posIter,status);
      }
      else if (TVar4 == kLong) {
        (*(this->super_Format).super_UObject._vptr_UObject[0xd])
                  (this,(ulong)*(uint *)&(local_48.num)->fValue,appendTo,posIter,status);
      }
      else if (TVar4 == kDouble) {
        (*(this->super_Format).super_UObject._vptr_UObject[10])
                  (((local_48.num)->fValue).fObject,this,appendTo,posIter,status);
      }
      else {
        *status = U_INVALID_FORMAT_ERROR;
      }
    }
    else {
      (*(this->super_Format).super_UObject._vptr_UObject[0x12])
                (this,(local_48.num)->fDecimalQuantity,appendTo,posIter,status);
    }
  }
  return appendTo;
}

Assistant:

UnicodeString&
NumberFormat::format(const Formattable& obj,
                        UnicodeString& appendTo,
                        FieldPositionIterator* posIter,
                        UErrorCode& status) const
{
    if (U_FAILURE(status)) return appendTo;

    ArgExtractor arg(*this, obj, status);
    const Formattable *n = arg.number();
    const UChar *iso = arg.iso();

    if(arg.wasCurrency() && u_strcmp(iso, getCurrency())) {
      // trying to format a different currency.
      // Right now, we clone.
      LocalPointer<NumberFormat> cloneFmt((NumberFormat*)this->clone());
      cloneFmt->setCurrency(iso, status);
      // next line should NOT recurse, because n is numeric whereas obj was a wrapper around currency amount.
      return cloneFmt->format(*n, appendTo, posIter, status);
    }

    if (n->isNumeric() && n->getDecimalQuantity() != NULL) {
        // Decimal Number
        format(*n->getDecimalQuantity(), appendTo, posIter, status);
    } else {
        switch (n->getType()) {
        case Formattable::kDouble:
            format(n->getDouble(), appendTo, posIter, status);
            break;
        case Formattable::kLong:
            format(n->getLong(), appendTo, posIter, status);
            break;
        case Formattable::kInt64:
            format(n->getInt64(), appendTo, posIter, status);
            break;
        default:
            status = U_INVALID_FORMAT_ERROR;
            break;
        }
    }

    return appendTo;
}